

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

string * __thiscall cfd::core::Psbt::GetBase64_abi_cxx11_(string *__return_storage_ptr__,Psbt *this)

{
  ByteData local_30;
  Psbt *local_18;
  Psbt *this_local;
  
  local_18 = this;
  this_local = (Psbt *)__return_storage_ptr__;
  GetData(&local_30,this);
  CryptoUtil::EncodeBase64_abi_cxx11_((CryptoUtil *)__return_storage_ptr__,&local_30);
  ByteData::~ByteData(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string Psbt::GetBase64() const {
  return CryptoUtil::EncodeBase64(GetData());
}